

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_scalar.cpp
# Opt level: O1

void __thiscall
ear::PolarExtentCoreScalar::run(PolarExtentCoreScalar *this,PolarExtentCoreContext *ctx)

{
  size_t sVar1;
  extent_float_t *peVar2;
  extent_float_t *peVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  ExtentPosition pos;
  ExtentPosition local_34;
  
  if (ctx->num_speakers != 0) {
    memset(ctx->results,0,ctx->num_speakers << 2);
  }
  if (ctx->num_points != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      local_34.x = ctx->xs[uVar6];
      local_34.y = ctx->ys[uVar6];
      local_34.z = ctx->zs[uVar6];
      if (ctx->is_circular == true) {
        fVar7 = weight_circle(this,ctx,&local_34);
      }
      else {
        fVar7 = weight_stadium(this,ctx,&local_34);
      }
      if ((fVar7 != 1.0) || (NAN(fVar7))) {
        if (((fVar7 != 0.0) || (NAN(fVar7))) && (sVar1 = ctx->num_speakers, sVar1 != 0)) {
          peVar2 = ctx->results;
          peVar3 = ctx->summed_panning_results;
          sVar4 = 0;
          do {
            peVar2[sVar4] =
                 *(float *)((long)peVar3 + sVar4 * 4 + sVar1 * lVar5) * fVar7 + peVar2[sVar4];
            sVar4 = sVar4 + 1;
          } while (sVar1 != sVar4);
        }
      }
      else {
        sVar1 = ctx->num_speakers;
        if (sVar1 != 0) {
          peVar2 = ctx->results;
          peVar3 = ctx->summed_panning_results;
          sVar4 = 0;
          do {
            peVar2[sVar4] = *(float *)((long)peVar3 + sVar4 * 4 + sVar1 * lVar5) + peVar2[sVar4];
            sVar4 = sVar4 + 1;
          } while (sVar1 != sVar4);
        }
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 4;
    } while (uVar6 < ctx->num_points);
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i++) {
        ExtentPosition pos;
        pos.x = ctx.xs[i];
        pos.y = ctx.ys[i];
        pos.z = ctx.zs[i];

        extent_float_t weight = ctx.is_circular ? weight_circle(ctx, pos)
                                                : weight_stadium(ctx, pos);

        // add to results, using summed_panning_results for both as this is in
        // a more efficient order
        if (weight == 1.0) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx++) {
            extent_float_t gain =
                ctx.summed_panning_results[i * ctx.num_speakers + speaker_idx];
            ctx.results[speaker_idx] += gain;
          }
        } else if (weight != 0) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx++) {
            extent_float_t gain =
                ctx.summed_panning_results[i * ctx.num_speakers + speaker_idx];
            ctx.results[speaker_idx] += weight * gain;
          }
        }
      }
    }